

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::VariableSymbol::checkInitializer(VariableSymbol *this)

{
  bool bVar1;
  Symbol *pSVar2;
  bitmask<slang::ast::ASTFlags> in_RDI;
  LookupLocation LVar3;
  StaticInitializerVisitor visitor;
  ASTContext context;
  Expression *init;
  Scope *scope;
  StaticInitializerVisitor *in_stack_ffffffffffffff58;
  Expression *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  SymbolKind SVar4;
  StaticInitializerVisitor in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> local_78;
  Scope *local_70;
  uint32_t local_68;
  Scope *local_60;
  uint32_t local_58;
  ASTContext local_50;
  Expression *local_18;
  Symbol *local_10;
  
  if ((((Symbol *)in_RDI.m_bits)->kind == Variable) &&
     (*(int *)&(((Symbol *)(in_RDI.m_bits + 0x140))->name)._M_str == 1)) {
    local_10 = (Symbol *)Symbol::getParentScope((Symbol *)in_RDI.m_bits);
    pSVar2 = Scope::asSymbol((Scope *)local_10);
    SVar4 = pSVar2->kind;
    if (((SVar4 == CompilationUnit) ||
        (((SVar4 == InstanceBody || (SVar4 == Package)) || (SVar4 == GenerateBlock)))) &&
       ((local_18 = ValueSymbol::getInitializer((ValueSymbol *)0x70a101),
        local_18 != (Expression *)0x0 &&
        (bVar1 = Expression::bad(in_stack_ffffffffffffff60), !bVar1)))) {
      pSVar2 = local_10;
      LVar3 = LookupLocation::after(local_10);
      local_70 = LVar3.scope;
      local_68 = LVar3.index;
      local_60 = local_70;
      local_58 = local_68;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_78,None);
      ASTContext::ASTContext
                ((ASTContext *)CONCAT44(SVar4,in_stack_ffffffffffffff68),(Scope *)pSVar2,
                 (LookupLocation)in_stack_ffffffffffffff78,in_RDI);
      StaticInitializerVisitor::StaticInitializerVisitor
                ((StaticInitializerVisitor *)&stack0xffffffffffffff78,&local_50,
                 (Symbol *)in_RDI.m_bits);
      Expression::visit<slang::ast::StaticInitializerVisitor&>
                ((Expression *)pSVar2,in_stack_ffffffffffffff58);
    }
  }
  return;
}

Assistant:

void VariableSymbol::checkInitializer() const {
    // Check the initializer expression of static variables
    // for references to other values that have indeterminate
    // initialization order.
    if (kind != SymbolKind::Variable || lifetime != VariableLifetime::Static)
        return;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    switch (scope->asSymbol().kind) {
        case SymbolKind::InstanceBody:
        case SymbolKind::GenerateBlock:
        case SymbolKind::Package:
        case SymbolKind::CompilationUnit:
            if (auto init = getInitializer(); init && !init->bad()) {
                ASTContext context(*scope, LookupLocation::after(*this));
                StaticInitializerVisitor visitor(context, *this);
                init->visit(visitor);
            }
            break;
        default:
            break;
    }
}